

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_fmt_conv.c
# Opt level: O3

void ihevcd_fmt_conv_420sp_to_rgba8888
               (UWORD8 *pu1_y_src,UWORD8 *pu1_uv_src,UWORD32 *pu4_rgba_dst,WORD32 wd,WORD32 ht,
               WORD32 src_y_strd,WORD32 src_uv_strd,WORD32 dst_strd,WORD32 is_u_first)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  byte *pbVar12;
  UWORD32 *pUVar13;
  byte *pbVar14;
  uint uVar15;
  int iVar16;
  short local_74;
  
  if (0 < ht >> 1) {
    pUVar13 = pu4_rgba_dst + dst_strd;
    pbVar6 = pu1_uv_src;
    pbVar12 = pu1_uv_src + 1;
    if (is_u_first == 0) {
      pbVar6 = pu1_uv_src + 1;
      pbVar12 = pu1_uv_src;
    }
    pbVar14 = pu1_y_src + src_y_strd;
    lVar10 = (long)wd;
    lVar11 = -lVar10;
    sVar7 = 0;
    do {
      local_74 = (short)((uint)wd >> 1);
      iVar4 = ((uint)wd >> 1) + 1;
      if (0 < local_74) {
        do {
          uVar15 = (uint)*pu1_y_src;
          iVar8 = (int)((*pbVar6 - 0x80) * 0x20490) >> 0x10;
          uVar9 = iVar8 + uVar15;
          if ((int)(iVar8 + uVar15) < 1) {
            uVar9 = 0;
          }
          if (0xfe < (int)uVar9) {
            uVar9 = 0xff;
          }
          iVar16 = (int)(short)((*pbVar12 - 0x80) * 0x1fffe5f8 + (*pbVar6 - 0x80) * 0x1ffff379 >>
                               0xd);
          iVar2 = iVar16 + uVar15;
          uVar3 = iVar2 * 0x100;
          if (iVar2 < 0) {
            uVar3 = 0;
          }
          if (0xff < iVar2) {
            uVar3 = 0xff00;
          }
          iVar5 = (int)((*pbVar12 - 0x80) * 0x19888) >> 0x10;
          iVar2 = uVar15 + iVar5;
          uVar15 = iVar2 * 0x10000;
          if (iVar2 < 0) {
            uVar15 = 0;
          }
          if (0xff < iVar2) {
            uVar15 = 0xff0000;
          }
          *pu4_rgba_dst = uVar15 | uVar9 | uVar3;
          uVar15 = (uint)pu1_y_src[1];
          uVar9 = iVar8 + uVar15;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if (0xfe < (int)uVar9) {
            uVar9 = 0xff;
          }
          iVar2 = iVar16 + uVar15;
          uVar3 = iVar2 * 0x100;
          if (iVar2 < 0) {
            uVar3 = 0;
          }
          if (0xff < iVar2) {
            uVar3 = 0xff00;
          }
          iVar2 = uVar15 + iVar5;
          uVar15 = iVar2 * 0x10000;
          if (iVar2 < 0) {
            uVar15 = 0;
          }
          if (0xff < iVar2) {
            uVar15 = 0xff0000;
          }
          pu4_rgba_dst[1] = uVar15 | uVar9 | uVar3;
          uVar15 = (uint)*pbVar14;
          uVar9 = iVar8 + uVar15;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if (0xfe < (int)uVar9) {
            uVar9 = 0xff;
          }
          iVar2 = iVar16 + uVar15;
          uVar3 = iVar2 * 0x100;
          if (iVar2 < 0) {
            uVar3 = 0;
          }
          if (0xff < iVar2) {
            uVar3 = 0xff00;
          }
          iVar2 = uVar15 + iVar5;
          uVar15 = iVar2 * 0x10000;
          if (iVar2 < 0) {
            uVar15 = 0;
          }
          if (0xff < iVar2) {
            uVar15 = 0xff0000;
          }
          *pUVar13 = uVar15 | uVar9 | uVar3;
          bVar1 = pbVar14[1];
          uVar9 = iVar8 + (uint)bVar1;
          if ((int)uVar9 < 1) {
            uVar9 = 0;
          }
          if (0xfe < (int)uVar9) {
            uVar9 = 0xff;
          }
          pbVar6 = pbVar6 + 2;
          pbVar12 = pbVar12 + 2;
          pu1_y_src = pu1_y_src + 2;
          iVar16 = iVar16 + (uint)bVar1;
          uVar15 = iVar16 * 0x100;
          if (iVar16 < 0) {
            uVar15 = 0;
          }
          if (0xff < iVar16) {
            uVar15 = 0xff00;
          }
          iVar5 = iVar5 + (uint)bVar1;
          uVar3 = iVar5 * 0x10000;
          if (iVar5 < 0) {
            uVar3 = 0;
          }
          if (0xff < iVar5) {
            uVar3 = 0xff0000;
          }
          pUVar13[1] = uVar3 | uVar9 | uVar15;
          pbVar14 = pbVar14 + 2;
          pUVar13 = pUVar13 + 2;
          iVar4 = iVar4 + -1;
          pu4_rgba_dst = pu4_rgba_dst + 2;
        } while (1 < (ushort)iVar4);
      }
      pbVar6 = pbVar6 + lVar11 + src_uv_strd;
      pbVar12 = pbVar12 + lVar11 + src_uv_strd;
      pu1_y_src = pu1_y_src + lVar11 + src_y_strd * 2;
      pbVar14 = pbVar14 + lVar11 + src_y_strd * 2;
      pu4_rgba_dst = pUVar13 + (dst_strd - lVar10);
      pUVar13 = pUVar13 + (dst_strd * 2 - lVar10);
      sVar7 = sVar7 + 1;
    } while ((int)sVar7 < ht >> 1);
  }
  return;
}

Assistant:

void ihevcd_fmt_conv_420sp_to_rgba8888(UWORD8 *pu1_y_src,
                                       UWORD8 *pu1_uv_src,
                                       UWORD32 *pu4_rgba_dst,
                                       WORD32 wd,
                                       WORD32 ht,
                                       WORD32 src_y_strd,
                                       WORD32 src_uv_strd,
                                       WORD32 dst_strd,
                                       WORD32 is_u_first)
{


    WORD16  i2_r, i2_g, i2_b;
    UWORD32  u4_r, u4_g, u4_b;
    WORD16  i2_i, i2_j;
    UWORD8  *pu1_y_src_nxt;
    UWORD32 *pu4_rgba_dst_NextRow;

    UWORD8 *pu1_u_src, *pu1_v_src;

    if(is_u_first)
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src;
        pu1_v_src = (UWORD8 *)pu1_uv_src + 1;
    }
    else
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src + 1;
        pu1_v_src = (UWORD8 *)pu1_uv_src;
    }

    pu1_y_src_nxt   = pu1_y_src + src_y_strd;
    pu4_rgba_dst_NextRow = pu4_rgba_dst + dst_strd;

    for(i2_i = 0; i2_i < (ht >> 1); i2_i++)
    {
        for(i2_j = (wd >> 1); i2_j > 0; i2_j--)
        {
            i2_b = ((*pu1_u_src - 128) * COEFF4 >> 13);
            i2_g = ((*pu1_u_src - 128) * COEFF2 + (*pu1_v_src - 128) * COEFF3) >> 13;
            i2_r = ((*pu1_v_src - 128) * COEFF1) >> 13;

            pu1_u_src += 2;
            pu1_v_src += 2;
            /* pixel 0 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src + i2_r);

            pu1_y_src++;
            *pu4_rgba_dst++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 1 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src + i2_r);

            pu1_y_src++;
            *pu4_rgba_dst++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 2 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src_nxt + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src_nxt + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src_nxt + i2_r);

            pu1_y_src_nxt++;
            *pu4_rgba_dst_NextRow++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

            /* pixel 3 */
            /* B */
            u4_b = CLIP_U8(*pu1_y_src_nxt + i2_b);
            /* G */
            u4_g = CLIP_U8(*pu1_y_src_nxt + i2_g);
            /* R */
            u4_r = CLIP_U8(*pu1_y_src_nxt + i2_r);

            pu1_y_src_nxt++;
            *pu4_rgba_dst_NextRow++ = ((u4_r << 16) | (u4_g << 8) | (u4_b << 0));

        }

        pu1_u_src = pu1_u_src + src_uv_strd - wd;
        pu1_v_src = pu1_v_src + src_uv_strd - wd;

        pu1_y_src = pu1_y_src + (src_y_strd << 1) - wd;
        pu1_y_src_nxt = pu1_y_src_nxt + (src_y_strd << 1) - wd;

        pu4_rgba_dst = pu4_rgba_dst_NextRow - wd + dst_strd;
        pu4_rgba_dst_NextRow = pu4_rgba_dst_NextRow + (dst_strd << 1) - wd;
    }


}